

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

int32 dumbfile_mem_getnc(char *ptr,int32 n,void *f)

{
  undefined8 local_30;
  long max;
  dumbfile_mem_status *s;
  void *f_local;
  int32 n_local;
  char *ptr_local;
  
  local_30 = (ulong)(uint)(*(int *)((long)f + 0xc) - *(int *)((long)f + 8));
  if ((long)n < (long)local_30) {
    local_30 = (ulong)n;
  }
  if (local_30 != 0) {
    memcpy(ptr,(void *)(*f + (ulong)*(uint *)((long)f + 8)),local_30);
    *(int *)((long)f + 8) = *(int *)((long)f + 8) + (int)local_30;
  }
  return (int)local_30;
}

Assistant:

static int32 DUMBCALLBACK dumbfile_mem_getnc(char *ptr, int32 n, void *f)
{
	dumbfile_mem_status * s = (dumbfile_mem_status *) f;
	long max = s->size - s->offset;
	if (max > n) max = n;
	if (max)
	{
		memcpy(ptr, s->ptr + s->offset, max);
		s->offset += max;
	}
	return max;
}